

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.hpp
# Opt level: O2

bool cs::translator_type::compare(token_base *a,token_base *b)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  bVar3 = a == (token_base *)0x0 && b == (token_base *)0x0;
  if (b != (token_base *)0x0 && a != (token_base *)0x0) {
    iVar1 = (*a->_vptr_token_base[2])();
    iVar2 = (*b->_vptr_token_base[2])(b);
    if (iVar1 == iVar2) {
      iVar1 = (*a->_vptr_token_base[2])(a);
      bVar3 = true;
      if (iVar1 == 2) {
        bVar3 = *(int *)&a[1]._vptr_token_base == *(int *)&b[1]._vptr_token_base;
      }
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

static bool compare(const token_base *a, const token_base *b)
		{
			if (a == nullptr)
				return b == nullptr;
			if (b == nullptr)
				return a == nullptr;
			if (a->get_type() != b->get_type())
				return false;
			return a->get_type() != token_types::action || static_cast<const token_action *>(a)->get_action() ==
			       static_cast<const token_action *>(b)->get_action();
		}